

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O3

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,gpt_params *params)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  pointer *pppgVar1;
  int iVar2;
  mapped_type pgVar3;
  _Base_ptr p_Var4;
  iterator __position;
  mapped_type pgVar5;
  void *pvVar6;
  FILE *__stream;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *pmVar7;
  pointer pcVar8;
  long *plVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  value_type *__val;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  long lVar16;
  ggml_context *pgVar17;
  ggml_tensor *pgVar18;
  mapped_type *ppgVar19;
  undefined8 *puVar20;
  long *plVar21;
  mapped_type *ppgVar22;
  int *piVar23;
  gpt_vocab *pgVar24;
  long lVar25;
  undefined8 uVar26;
  ggml_backend_buffer_t pgVar27;
  iterator iVar28;
  size_type __new_size;
  undefined8 uVar29;
  undefined8 uVar30;
  ulong uVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  mapped_type pgVar33;
  long *plVar34;
  uint uVar35;
  string *psVar36;
  long *plVar37;
  long *plVar38;
  undefined4 uVar39;
  uint uVar40;
  string *psVar41;
  bool bVar42;
  long lVar43;
  pointer pgVar44;
  ulong uVar45;
  gpt2_hparams *hparams;
  gpt2_model *pgVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
  tensor_backends;
  int32_t n_vocab;
  map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
  backend_buffers;
  gpt2_hparams *hparams_1;
  int32_t length;
  int32_t n_dims;
  uint32_t len;
  ggml_tallocr alloc;
  int32_t ne [2];
  int32_t ttype;
  ifstream fin;
  undefined1 local_380 [8];
  char *local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Base_ptr local_360;
  size_t local_358;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_340;
  _Base_ptr p_Stack_330;
  undefined1 local_328 [8];
  undefined1 auStack_320 [24];
  _Base_ptr local_308;
  size_t local_300;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *local_2f0;
  string *local_2e8;
  gpt2_model *local_2e0;
  gpt_vocab *local_2d8;
  string *local_2d0;
  mapped_type local_2c8;
  mapped_type local_2c0;
  gpt_params *local_2b8;
  undefined1 local_2b0 [4];
  int local_2ac;
  vector<char,_std::allocator<char>_> local_2a8;
  vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  int32_t *local_268;
  int local_260 [4];
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  long local_238 [4];
  uint auStack_218 [122];
  
  local_2d8 = vocab;
  local_2b8 = params;
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p);
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  if ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 5) == 0) {
    std::istream::read((char *)local_238,(long)local_380);
    if (local_380._0_4_ != 0x67676d6c) {
      bVar42 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",
              (fname->_M_dataplus)._M_p);
      goto LAB_00109f91;
    }
    std::istream::read((char *)local_238,(long)model);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_ctx);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_embd);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_head);
    local_268 = &(model->hparams).n_layer;
    std::istream::read((char *)local_238,(long)local_268);
    local_2f0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 *)&(model->hparams).ftype;
    std::istream::read((char *)local_238,(long)local_2f0);
    iVar12 = (model->hparams).ftype;
    printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_vocab);
    printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_ctx);
    printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_embd);
    printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_head);
    printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_layer);
    printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).ftype);
    printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)(uint)(iVar12 / 1000));
    (model->hparams).ftype = (model->hparams).ftype % 1000;
    local_350._0_8_ = (ulong)(uint)local_350._4_4_ << 0x20;
    std::istream::read((char *)local_238,(long)local_350);
    if (local_350._0_4_ != (model->hparams).n_vocab) {
      bVar42 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load",
              (fname->_M_dataplus)._M_p);
      goto LAB_00109f91;
    }
    local_380 = (undefined1  [8])&local_370;
    local_378 = (char *)0x0;
    local_370._M_allocated_capacity = local_370._M_allocated_capacity & 0xffffffffffffff00;
    auStack_320._8_8_ = (pointer)0x0;
    local_328 = (undefined1  [8])0x0;
    auStack_320._0_8_ = (pointer)0x0;
    local_328 = (undefined1  [8])operator_new(0x80);
    auStack_320._0_8_ = (long)local_328 + 0x80;
    *(long *)((long)local_328 + 0x70) = 0;
    *(long *)((long)local_328 + 0x78) = 0;
    *(long *)((long)local_328 + 0x60) = 0;
    *(long *)((long)local_328 + 0x68) = 0;
    *(long *)((long)local_328 + 0x50) = 0;
    *(long *)((long)local_328 + 0x58) = 0;
    *(long *)((long)local_328 + 0x40) = 0;
    *(long *)((long)local_328 + 0x48) = 0;
    *(long *)((long)local_328 + 0x30) = 0;
    *(long *)((long)local_328 + 0x38) = 0;
    *(long *)((long)local_328 + 0x20) = 0;
    *(long *)((long)local_328 + 0x28) = 0;
    *(long *)((long)local_328 + 0x10) = 0;
    *(long *)((long)local_328 + 0x18) = 0;
    *(long *)local_328 = 0;
    *(long *)((long)local_328 + 8) = 0;
    local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
    auStack_320._8_8_ = auStack_320._0_8_;
    local_2e0 = model;
    if ((int)local_350._0_4_ < 1) {
LAB_00107a62:
      pgVar46 = local_2e0;
      operator_delete((void *)local_328,auStack_320._8_8_ - (long)local_328);
    }
    else {
      this = &local_2d8->id_to_token;
      local_2e8 = fname;
      do {
        std::istream::read((char *)local_238,(long)&local_2a8);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_328,
                   (ulong)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff);
        std::istream::read((char *)local_238,(long)local_328);
        std::__cxx11::string::_M_replace((ulong)local_380,0,local_378,(ulong)local_328);
        uVar39 = local_288._0_4_;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&local_2d8->token_to_id,(key_type *)local_380);
        *pmVar14 = uVar39;
        pmVar15 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this,(key_type *)local_288);
        std::__cxx11::string::_M_assign((string *)pmVar15);
        iVar12 = local_288._0_4_ + 1;
        local_288._0_4_ = iVar12;
      } while (iVar12 < (int)local_350._0_4_);
      fname = local_2e8;
      pgVar46 = local_2e0;
      if (local_328 != (undefined1  [8])0x0) goto LAB_00107a62;
    }
    pmVar7 = local_2f0;
    if (local_380 != (undefined1  [8])&local_370) {
      operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
    }
    iVar12 = ggml_ftype_to_ggml_type(*(undefined4 *)&(pmVar7->_M_t)._M_impl);
    if (iVar12 == 0x27) {
      bVar42 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
              (ggml_backend *)(fname->_M_dataplus)._M_p,(ulong)*(uint *)&(pmVar7->_M_t)._M_impl);
      goto LAB_00109f91;
    }
    local_2c8 = (mapped_type)CONCAT44(local_2c8._4_4_,iVar12);
    iVar12 = (pgVar46->hparams).n_layer;
    lVar16 = ggml_tensor_overhead();
    lVar16 = lVar16 * ((long)iVar12 * 0xc + 0xb);
    uStack_248 = 0;
    local_240 = 1;
    uVar30 = 0;
    local_250 = lVar16;
    pgVar17 = (ggml_context *)ggml_init();
    pgVar46->ctx_w = pgVar17;
    if (pgVar17 != (ggml_context *)0x0) {
      lVar43 = (long)(pgVar46->hparams).n_embd;
      local_2d0 = (string *)(long)(pgVar46->hparams).n_layer;
      iVar12 = (pgVar46->hparams).n_ctx;
      iVar2 = (pgVar46->hparams).n_vocab;
      std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                (&pgVar46->layers,(size_type)local_2d0);
      pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,lVar43);
      pgVar46->ln_f_g = pgVar18;
      pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,lVar43);
      pgVar46->ln_f_b = pgVar18;
      pgVar18 = (ggml_tensor *)
                ggml_new_tensor_2d(pgVar46->ctx_w,(ulong)local_2c8 & 0xffffffff,lVar43,(long)iVar2);
      pgVar46->wte = pgVar18;
      pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar46->ctx_w,0,lVar43,(long)iVar12);
      pgVar46->wpe = pgVar18;
      pgVar18 = (ggml_tensor *)
                ggml_new_tensor_2d(pgVar46->ctx_w,(ulong)local_2c8 & 0xffffffff,lVar43);
      pgVar46->lm_head = pgVar18;
      pgVar3 = pgVar46->ln_f_g;
      local_380 = (undefined1  [8])&local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"model/ln_f/g","");
      local_2f0 = &pgVar46->tensors;
      ppgVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[](local_2f0,(key_type *)local_380);
      *ppgVar19 = pgVar3;
      if (local_380 != (undefined1  [8])&local_370) {
        operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
      }
      pgVar3 = pgVar46->ln_f_b;
      local_380 = (undefined1  [8])&local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"model/ln_f/b","");
      ppgVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[](local_2f0,(key_type *)local_380);
      *ppgVar19 = pgVar3;
      if (local_380 != (undefined1  [8])&local_370) {
        operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
      }
      pgVar3 = pgVar46->wte;
      local_380 = (undefined1  [8])&local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"model/wte","");
      ppgVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[](local_2f0,(key_type *)local_380);
      *ppgVar19 = pgVar3;
      if (local_380 != (undefined1  [8])&local_370) {
        operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
      }
      pgVar3 = pgVar46->wpe;
      local_380 = (undefined1  [8])&local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"model/wpe","");
      ppgVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[](local_2f0,(key_type *)local_380);
      *ppgVar19 = pgVar3;
      if (local_380 != (undefined1  [8])&local_370) {
        operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
      }
      pgVar3 = pgVar46->lm_head;
      local_380 = (undefined1  [8])&local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"model/lm_head","");
      ppgVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[](local_2f0,(key_type *)local_380);
      *ppgVar19 = pgVar3;
      local_2c0 = (mapped_type)lVar43;
      if (local_380 != (undefined1  [8])&local_370) {
        operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
      }
      if (0 < (int)local_2d0) {
        local_2e8 = (string *)((long)local_2c0 * 3);
        local_2d8 = (gpt_vocab *)(long)((int)local_2c0 * 4);
        uVar45 = 0;
        uVar39 = local_2c8._0_4_;
        do {
          pgVar33 = local_2c0;
          pgVar44 = (pgVar46->layers).super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar45;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,local_2c0);
          pgVar44->ln_1_g = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,pgVar33);
          pgVar44->ln_1_b = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,pgVar33);
          pgVar44->ln_2_g = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,pgVar33);
          pgVar44->ln_2_b = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar46->ctx_w,uVar39,pgVar33,local_2e8);
          pgVar44->c_attn_attn_w = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,local_2e8);
          pgVar44->c_attn_attn_b = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar46->ctx_w,uVar39,pgVar33,pgVar33);
          pgVar44->c_attn_proj_w = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,pgVar33);
          pgVar44->c_attn_proj_b = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar46->ctx_w,uVar39,pgVar33,local_2d8);
          pgVar44->c_mlp_fc_w = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,local_2d8);
          pgVar44->c_mlp_fc_b = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar46->ctx_w,uVar39,local_2d8,pgVar33);
          pgVar44->c_mlp_proj_w = pgVar18;
          pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,pgVar33);
          pgVar44->c_mlp_proj_b = pgVar18;
          uVar40 = 1;
          plVar38 = (long *)(auStack_320 + 8);
          uVar35 = (uint)uVar45;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00107efa;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00107efa;
              }
              if (uVar13 < 10000) goto LAB_00107efa;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00107efa:
          pgVar3 = pgVar44->ln_1_g;
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->ln_1_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_0010809c;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_0010809c;
              }
              if (uVar13 < 10000) goto LAB_0010809c;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_0010809c:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->ln_2_g;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_0010823a;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_0010823a;
              }
              if (uVar13 < 10000) goto LAB_0010823a;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_0010823a:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->ln_2_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_001083d8;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_001083d8;
              }
              if (uVar13 < 10000) goto LAB_001083d8;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_001083d8:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_attn_attn_w;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108576;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108576;
              }
              if (uVar13 < 10000) goto LAB_00108576;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108576:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_attn_attn_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108714;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108714;
              }
              if (uVar13 < 10000) goto LAB_00108714;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108714:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_attn_proj_w;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_001088b2;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_001088b2;
              }
              if (uVar13 < 10000) goto LAB_001088b2;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_001088b2:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_attn_proj_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108a50;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108a50;
              }
              if (uVar13 < 10000) goto LAB_00108a50;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108a50:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_mlp_fc_w;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108bee;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108bee;
              }
              if (uVar13 < 10000) goto LAB_00108bee;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108bee:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_mlp_fc_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108d8c;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108d8c;
              }
              if (uVar13 < 10000) goto LAB_00108d8c;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108d8c:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_mlp_proj_w;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_00108f2a;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_00108f2a;
              }
              if (uVar13 < 10000) goto LAB_00108f2a;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_00108f2a:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,(ulong)(auStack_320._8_8_ + 1));
          }
          if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          pgVar3 = pgVar44->c_mlp_proj_b;
          uVar40 = 1;
          if (9 < uVar45) {
            uVar10 = 4;
            uVar31 = uVar45;
            do {
              uVar40 = uVar10;
              uVar13 = (uint)uVar31;
              if (uVar13 < 100) {
                uVar40 = uVar40 - 2;
                goto LAB_001090cd;
              }
              if (uVar13 < 1000) {
                uVar40 = uVar40 - 1;
                goto LAB_001090cd;
              }
              if (uVar13 < 10000) goto LAB_001090cd;
              uVar31 = (uVar31 & 0xffffffff) / 10000;
              uVar10 = uVar40 + 4;
            } while (99999 < uVar13);
            uVar40 = uVar40 + 1;
          }
LAB_001090cd:
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_350,(char)uVar40);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_350._0_8_,uVar40,uVar35);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0x122262);
          plVar21 = puVar20 + 2;
          uVar39 = local_2c8._0_4_;
          if ((long *)*puVar20 == plVar21) {
            auStack_320._8_8_ = *plVar21;
            auStack_320._16_8_ = puVar20[3];
            local_328 = (undefined1  [8])plVar38;
          }
          else {
            auStack_320._8_8_ = *plVar21;
            local_328 = (undefined1  [8])*puVar20;
          }
          auStack_320._0_8_ = puVar20[1];
          *puVar20 = plVar21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          plVar21 = (long *)std::__cxx11::string::append(local_328);
          local_380 = (undefined1  [8])&local_370;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 == paVar32) {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_370._8_8_ = plVar21[3];
          }
          else {
            local_370._M_allocated_capacity = paVar32->_M_allocated_capacity;
            local_380 = (undefined1  [8])*plVar21;
          }
          local_378 = (char *)plVar21[1];
          *plVar21 = (long)paVar32;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_380);
          *ppgVar19 = pgVar3;
          if (local_380 != (undefined1  [8])&local_370) {
            operator_delete((void *)local_380,local_370._M_allocated_capacity + 1);
          }
          pgVar46 = local_2e0;
          if (local_328 != (undefined1  [8])plVar38) {
            operator_delete((void *)local_328,auStack_320._8_8_ + 1);
          }
          if ((mapped_type)local_350._0_8_ != (mapped_type)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          uVar45 = uVar45 + 1;
        } while ((string *)uVar45 != local_2d0);
      }
      init_backends(pgVar46,local_2b8);
      psVar41 = (string *)
                (pgVar46->backends).
                super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar36 = (string *)
                (pgVar46->backends).
                super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_2c8 = (mapped_type)(psVar41->_M_dataplus)._M_p;
      local_2c0 = *(mapped_type *)((long)&psVar36[-1].field_2 + 8);
      local_370._8_8_ = &local_378;
      local_378 = (char *)((ulong)local_378 & 0xffffffff00000000);
      local_370._M_allocated_capacity = 0;
      local_358 = 0;
      pgVar24 = (gpt_vocab *)(pgVar46->tensors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      local_2d8 = (gpt_vocab *)&(pgVar46->tensors)._M_t._M_impl.super__Rb_tree_header;
      local_360 = (_Base_ptr)local_370._8_8_;
      if (pgVar24 != local_2d8) {
        local_2d0 = (string *)
                    CONCAT44(local_2d0._4_4_,(pgVar46->hparams).n_layer - local_2b8->n_gpu_layers);
        do {
          local_328 = (undefined1  [8])(auStack_320 + 8);
          p_Var4 = (pgVar24->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_328,p_Var4,
                     (long)&p_Var4->_M_color +
                     (pgVar24->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_308 = (pgVar24->id_to_token)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          iVar12 = std::__cxx11::string::compare((char *)local_328);
          if ((iVar12 == 0) ||
             (iVar12 = std::__cxx11::string::compare((char *)local_328), iVar12 == 0)) {
            if (*local_268 < local_2b8->n_gpu_layers) {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c8;
            }
            else {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c0;
            }
            *ppgVar22 = pgVar33;
          }
          iVar12 = std::__cxx11::string::compare((char *)local_328);
          if (((iVar12 == 0) ||
              (iVar12 = std::__cxx11::string::compare((char *)local_328), iVar12 == 0)) ||
             (iVar12 = std::__cxx11::string::compare((char *)local_328), iVar12 == 0)) {
            if (local_2b8->n_gpu_layers < 1) {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c0;
            }
            else {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c8;
            }
            *ppgVar22 = pgVar33;
          }
          std::__cxx11::string::substr((ulong)local_350,(ulong)local_328);
          iVar12 = std::__cxx11::string::compare(local_350);
          if ((mapped_type)local_350._0_8_ != (mapped_type)(local_350 + 0x10)) {
            operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
          }
          if (iVar12 == 0) {
            std::__cxx11::string::substr((ulong)local_350,(ulong)local_328);
            uVar26 = local_350._0_8_;
            piVar23 = __errno_location();
            local_2e8 = (string *)CONCAT44(local_2e8._4_4_,*piVar23);
            *piVar23 = 0;
            lVar43 = strtol((char *)uVar26,(char **)local_288,10);
            if (local_288._0_8_ == uVar26) {
              std::__throw_invalid_argument("stoi");
LAB_0010a052:
              uVar30 = std::__throw_out_of_range("stoi");
              std::
              _Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
              ::~_Rb_tree((_Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                           *)local_328);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                           *)local_380);
              std::ifstream::~ifstream(local_238);
              _Unwind_Resume(uVar30);
            }
            if (((int)lVar43 != lVar43) || (*piVar23 == 0x22)) goto LAB_0010a052;
            if (*piVar23 == 0) {
              *piVar23 = (uint)local_2e8;
            }
            if ((mapped_type)local_350._0_8_ != (mapped_type)(local_350 + 0x10)) {
              operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
            }
            if ((int)lVar43 < (int)local_2d0) {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c0;
            }
            else {
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_328);
              pgVar33 = local_2c8;
            }
            *ppgVar22 = pgVar33;
          }
          if (local_328 != (undefined1  [8])(auStack_320 + 8)) {
            operator_delete((void *)local_328,auStack_320._8_8_ + 1);
          }
          pgVar24 = (gpt_vocab *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar24);
        } while (pgVar24 != local_2d8);
        psVar41 = (string *)
                  (local_2e0->backends).
                  super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar36 = (string *)
                  (local_2e0->backends).
                  super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      auStack_320._16_8_ = auStack_320;
      auStack_320._0_8_ = auStack_320._0_8_ & 0xffffffff00000000;
      auStack_320._8_8_ = (long *)0x0;
      local_300 = 0;
      local_308 = (_Base_ptr)auStack_320._16_8_;
      local_2d0 = psVar36;
      if (psVar41 != psVar36) {
        local_290 = (vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                    &local_2e0->buffers_w;
        do {
          pgVar24 = (gpt_vocab *)
                    (local_2e0->tensors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_2e8 = psVar41;
          if (pgVar24 == local_2d8) {
LAB_001096fd:
            local_350._0_8_ = (mapped_type)0x0;
            std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
            emplace_back<ggml_backend_buffer*>(local_290,(ggml_backend_buffer **)local_350);
            psVar41 = local_2e8;
          }
          else {
            pgVar33 = (mapped_type)(psVar41->_M_dataplus)._M_p;
            lVar43 = 0;
            do {
              p_Var4 = (pgVar24->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              local_350._0_8_ = (ggml_backend *)(local_350 + 0x10);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_350,p_Var4,
                         (long)&p_Var4->_M_color +
                         (pgVar24->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_node_count);
              p_Stack_330 = (pgVar24->id_to_token)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                       *)local_380,(key_type *)local_350);
              if (*ppgVar22 == pgVar33) {
                lVar25 = ggml_nbytes(p_Stack_330);
                lVar43 = lVar43 + lVar25 + 0x200;
              }
              if ((ggml_backend *)local_350._0_8_ != (ggml_backend *)(local_350 + 0x10)) {
                operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
              }
              pgVar24 = (gpt_vocab *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar24);
            } while (pgVar24 != local_2d8);
            if (lVar43 == 0) goto LAB_001096fd;
            uVar26 = ggml_backend_name(pgVar33);
            auVar47._8_4_ = (int)((ulong)lVar43 >> 0x20);
            auVar47._0_8_ = lVar43;
            auVar47._12_4_ = 0x45300000;
            printf("%s: %8s buffer size = %8.2f MB\n",
                   ((auVar47._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar43) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,"gpt2_model_load",uVar26);
            local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ggml_backend_alloc_buffer(pgVar33,lVar43);
            psVar41 = local_2e8;
            ggml_backend_buffer_set_usage
                      (local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1);
            __position._M_current =
                 (local_2e0->buffers_w).
                 super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_2e0->buffers_w).
                super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
              _M_realloc_insert<ggml_backend_buffer*const&>
                        (local_290,__position,(ggml_backend_buffer **)&local_2a8);
            }
            else {
              *__position._M_current =
                   (ggml_backend_buffer *)
                   local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pppgVar1 = &(local_2e0->buffers_w).
                          super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppgVar1 = *pppgVar1 + 1;
            }
            ggml_tallocr_new(local_288,
                             local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            aStack_340._8_8_ = local_278._M_allocated_capacity;
            p_Stack_330 = (_Base_ptr)local_278._8_8_;
            local_350._8_8_ = local_288._0_8_;
            aStack_340._M_allocated_capacity = local_288._8_8_;
            local_350._0_8_ = pgVar33;
            std::
            _Rb_tree<ggml_backend*,std::pair<ggml_backend*const,ggml_tallocr>,std::_Select1st<std::pair<ggml_backend*const,ggml_tallocr>>,std::less<ggml_backend*>,std::allocator<std::pair<ggml_backend*const,ggml_tallocr>>>
            ::_M_emplace_unique<std::pair<ggml_backend*,ggml_tallocr>>
                      ((_Rb_tree<ggml_backend*,std::pair<ggml_backend*const,ggml_tallocr>,std::_Select1st<std::pair<ggml_backend*const,ggml_tallocr>>,std::less<ggml_backend*>,std::allocator<std::pair<ggml_backend*const,ggml_tallocr>>>
                        *)local_328,(pair<ggml_backend_*,_ggml_tallocr> *)local_350);
          }
          psVar41 = (string *)&psVar41->_M_string_length;
        } while (psVar41 != local_2d0);
      }
      pgVar46 = local_2e0;
      uVar45 = (long)(local_2e0->hparams).n_ctx * (long)(local_2e0->hparams).n_layer;
      lVar43 = (long)(local_2e0->hparams).n_embd * uVar45;
      pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(local_2e0->ctx_w,0,lVar43);
      pgVar46->memory_k = pgVar18;
      pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar46->ctx_w,0,lVar43);
      pgVar46->memory_v = pgVar18;
      ggml_set_name(pgVar46->memory_k,"model/memory_k");
      ggml_set_name(pgVar46->memory_v,"model/memory_v");
      lVar43 = ggml_nbytes(pgVar46->memory_k);
      pgVar33 = local_2c8;
      lVar25 = ggml_nbytes(pgVar46->memory_v);
      lVar25 = lVar25 + lVar43;
      auVar48._8_4_ = (int)((ulong)lVar25 >> 0x20);
      auVar48._0_8_ = lVar25;
      auVar48._12_4_ = 0x45300000;
      printf("%s: memory size = %8.2f MB, n_mem = %d\n",
             ((auVar48._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) * 0.0009765625 *
             0.0009765625,"gpt2_model_load",uVar45 & 0xffffffff);
      if (local_2b8->n_gpu_layers < *local_268 / 2) {
        pgVar33 = local_2c0;
      }
      uVar26 = ggml_backend_name(pgVar33);
      printf("%s: backend_kv = %s\n","gpt2_model_load",uVar26);
      pgVar27 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar33,lVar25 + 0x400);
      pgVar46 = local_2e0;
      local_2e0->buffer_kv = pgVar27;
      ggml_tallocr_new(local_350,pgVar27);
      ggml_tallocr_alloc(local_350,pgVar46->memory_k);
      ggml_tallocr_alloc(local_350,pgVar46->memory_v);
      local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_2d0 = (string *)0x0;
      local_2e8 = (string *)((ulong)local_2e8 & 0xffffffff00000000);
      do {
        std::istream::read((char *)local_238,(long)&local_2ac);
        std::istream::read((char *)local_238,(long)local_2b0);
        std::istream::read((char *)local_238,(long)(local_260 + 3));
        uVar40 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
        local_290 = (vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                    CONCAT44(local_290._4_4_,uVar40);
        uVar40 = uVar40 & 2;
        if (uVar40 != 0) {
          auVar49._0_8_ = (double)CONCAT44(0x43300000,(int)local_2d0);
          auVar49._8_4_ = (int)((ulong)local_2d0 >> 0x20);
          auVar49._12_4_ = 0x45300000;
          printf("%s: model size  = %8.2f MB\n",
                 ((auVar49._8_8_ - 1.9342813113834067e+25) + (auVar49._0_8_ - 4503599627370496.0)) *
                 0.0009765625 * 0.0009765625,"gpt2_model_load");
          break;
        }
        local_260[0] = 1;
        local_260[1] = 1;
        if (local_2ac < 1) {
          lVar43 = 1;
        }
        else {
          lVar43 = 1;
          piVar23 = local_260;
          lVar25 = 0;
          do {
            std::istream::read((char *)local_238,(long)piVar23);
            lVar43 = (long)(int)lVar43 * (long)*piVar23;
            lVar25 = lVar25 + 1;
            piVar23 = piVar23 + 1;
          } while (lVar25 < local_2ac);
        }
        local_350._0_8_ = local_350 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_350,local_2b0[0]);
        std::istream::read((char *)local_238,local_350._0_8_);
        iVar28 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::find(&local_2f0->_M_t,(key_type *)local_350);
        if ((gpt_vocab *)iVar28._M_node == local_2d8) {
          gpt2_model_load();
LAB_00109dbc:
          bVar42 = false;
          pgVar46 = local_2e0;
        }
        else {
          ppgVar19 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](local_2f0,(key_type *)local_350);
          pgVar3 = *ppgVar19;
          ggml_set_name(pgVar3,local_350._0_8_);
          lVar25 = ggml_nelements(pgVar3);
          if (lVar25 != lVar43) {
            gpt2_model_load();
            goto LAB_00109dbc;
          }
          if ((pgVar3->ne[0] != (long)local_260[0]) || (pgVar3->ne[1] != (long)local_260[1])) {
            uVar30 = CONCAT44((int)((ulong)uVar30 >> 0x20),local_260[1]);
            lVar16 = CONCAT44((int)((ulong)lVar16 >> 0x20),local_260[0]);
            fprintf(_stderr,
                    "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                    ,"gpt2_model_load",local_350._0_8_,pgVar3->ne[0],pgVar3->ne[1],lVar16,uVar30);
            goto LAB_00109dbc;
          }
          lVar43 = ggml_type_size(local_260[3]);
          uVar45 = ggml_blck_size(pgVar3->type);
          uVar31 = ggml_nbytes(pgVar3);
          uVar26 = local_350._0_8_;
          __stream = _stderr;
          if ((ulong)(lVar43 * lVar25) / uVar45 != uVar31) {
            uVar29 = ggml_nbytes(pgVar3);
            fprintf(__stream,
                    "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                    "gpt2_model_load",uVar26,uVar29,lVar43 * lVar25);
            goto LAB_00109dbc;
          }
          ppgVar22 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                   *)local_380,(key_type *)local_350);
          pgVar46 = local_2e0;
          pgVar33 = *ppgVar22;
          plVar38 = (long *)auStack_320;
          plVar21 = (long *)auStack_320;
          plVar9 = (long *)auStack_320._8_8_;
          if ((long *)auStack_320._8_8_ != (long *)0x0) {
            do {
              plVar34 = plVar9;
              plVar37 = plVar38;
              pgVar5 = (mapped_type)plVar34[4];
              plVar38 = plVar34;
              if (pgVar5 < pgVar33) {
                plVar38 = plVar37;
              }
              plVar9 = (long *)plVar34[(ulong)(pgVar5 < pgVar33) + 2];
            } while ((long *)plVar34[(ulong)(pgVar5 < pgVar33) + 2] != (long *)0x0);
            plVar21 = (long *)auStack_320;
            if (plVar38 != (long *)auStack_320) {
              if (pgVar5 < pgVar33) {
                plVar34 = plVar37;
              }
              plVar21 = plVar38;
              if (pgVar33 < (mapped_type)plVar34[4]) {
                plVar21 = (long *)auStack_320;
              }
            }
          }
          ggml_tallocr_alloc(plVar21 + 5,pgVar3);
          cVar11 = ggml_backend_is_cpu(pgVar33);
          if (cVar11 == '\0') {
            __new_size = ggml_nbytes(pgVar3);
            std::vector<char,_std::allocator<char>_>::resize(&local_2a8,__new_size);
            pcVar8 = local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ggml_nbytes(pgVar3);
            std::istream::read((char *)local_238,(long)pcVar8);
            pcVar8 = local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar26 = ggml_nbytes(pgVar3);
            ggml_backend_tensor_set(pgVar3,pcVar8,0,uVar26);
          }
          else {
            pvVar6 = pgVar3->data;
            ggml_nbytes(pgVar3);
            std::istream::read((char *)local_238,(long)pvVar6);
          }
          iVar12 = std::__cxx11::string::compare(local_350);
          if ((iVar12 == 0) && (((ulong)local_2e8 & 1) == 0)) {
            local_288._0_8_ = local_288 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"model/lm_head","");
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                     *)local_380,(key_type *)local_288);
            plVar38 = (long *)auStack_320;
            if ((long *)auStack_320._8_8_ != (long *)0x0) {
              pgVar33 = *ppgVar22;
              plVar21 = (long *)auStack_320;
              plVar9 = (long *)auStack_320._8_8_;
              do {
                plVar34 = plVar9;
                plVar37 = plVar21;
                pgVar5 = (mapped_type)plVar34[4];
                plVar21 = plVar34;
                if (pgVar5 < pgVar33) {
                  plVar21 = plVar37;
                }
                plVar9 = (long *)plVar34[(ulong)(pgVar5 < pgVar33) + 2];
              } while ((long *)plVar34[(ulong)(pgVar5 < pgVar33) + 2] != (long *)0x0);
              if (plVar21 != (long *)auStack_320) {
                if (pgVar5 < pgVar33) {
                  plVar34 = plVar37;
                }
                plVar38 = plVar21;
                if (pgVar33 < (mapped_type)plVar34[4]) {
                  plVar38 = (long *)auStack_320;
                }
              }
            }
            if ((mapped_type)local_288._0_8_ != (mapped_type)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
            }
            ggml_tallocr_alloc(plVar38 + 5,pgVar46->lm_head);
            ggml_backend_tensor_copy(pgVar3,pgVar46->lm_head);
            lVar43 = ggml_nbytes(pgVar46->lm_head);
            local_2d0 = (string *)((long)local_2d0 + lVar43);
          }
          iVar12 = std::__cxx11::string::compare(local_350);
          lVar43 = ggml_nbytes(pgVar3);
          uVar35 = (uint)local_2e8 & 0xff;
          if (iVar12 == 0) {
            uVar35 = 1;
          }
          local_2e8 = (string *)CONCAT44(local_2e8._4_4_,uVar35);
          local_2d0 = (string *)((long)local_2d0 + lVar43);
          bVar42 = true;
        }
        if ((mapped_type)local_350._0_8_ != (mapped_type)(local_350 + 0x10)) {
          operator_delete((void *)local_350._0_8_,aStack_340._M_allocated_capacity + 1);
        }
      } while (bVar42);
      if ((ggml_backend_buffer *)
          local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (ggml_backend_buffer *)0x0) {
        operator_delete(local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pgVar33 = local_2c8;
      if (((ulong)local_290 & 2) != 0) {
        std::ifstream::close();
        pgVar18 = (ggml_tensor *)
                  ggml_new_tensor_1d(pgVar46->ctx_w,0x1a,(long)(pgVar46->hparams).n_ctx);
        pgVar46->embd = pgVar18;
        pgVar18 = (ggml_tensor *)
                  ggml_new_tensor_1d(pgVar46->ctx_w,0x1a,(long)(pgVar46->hparams).n_ctx);
        pgVar46->position = pgVar18;
        ggml_set_name(pgVar46->embd,"in/embd");
        ggml_set_name(pgVar46->position,"in/position");
        lVar16 = ggml_nbytes(pgVar46->embd);
        lVar43 = ggml_nbytes(pgVar46->position);
        if (local_2b8->n_gpu_layers < *local_268) {
          pgVar33 = local_2c0;
        }
        pgVar27 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar33,lVar43 + lVar16 + 0x600);
        pgVar46->buffer_input = pgVar27;
        uVar30 = ggml_backend_name(pgVar33);
        printf("%s: backend_in = %s (%zu bytes)\n","gpt2_model_load",uVar30,lVar43 + lVar16);
        ggml_tallocr_new(local_350,pgVar46->buffer_input);
        ggml_tallocr_alloc(local_350,pgVar46->embd);
        ggml_tallocr_alloc(local_350,pgVar46->position);
      }
      bVar42 = SUB41(uVar40 >> 1,0);
      std::
      _Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
      ::~_Rb_tree((_Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                   *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                   *)local_380);
      goto LAB_00109f91;
    }
    gpt2_model_load();
  }
  else {
    gpt2_model_load();
  }
  bVar42 = false;
LAB_00109f91:
  std::ifstream::~ifstream(local_238);
  return bVar42;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, const gpt_params & params) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    // create the ggml context
    {
        size_t n_tensors = 3 /* input */ + 2 /* kv */ + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // create tensors for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // assign tensors to backends
    init_backends(model, params);
    ggml_backend_t backend_gpu = model.backends.front();
    ggml_backend_t backend_cpu = model.backends.back();
    std::map<std::string, ggml_backend_t> tensor_backends;
    {
        const int i_gpu_first_layer = model.hparams.n_layer - params.n_gpu_layers;
        for (auto it : model.tensors) {
            const std::string & name = it.first;
            // input tensors
            if (name == "model/wte" || name == "model/wpe") {
                if (params.n_gpu_layers > model.hparams.n_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // output tensors
            if (name == "model/ln_f/g" || name == "model/ln_f/b" || name == "model/lm_head") {
                if (params.n_gpu_layers > 0) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // layer tensors
            if (name.substr(0, 7) == "model/h") {
                // parse layer number
                int layer = std::stoi(name.substr(7, 2));
                if (layer >= i_gpu_first_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
        }
    }

    // allocate buffers
    std::map<ggml_backend_t, ggml_tallocr> backend_buffers;
    for (auto backend : model.backends) {
        // compute the size of the buffer
        size_t size = 0;
        for (auto it : model.tensors) {
            if (tensor_backends[it.first] == backend) {
                size += ggml_nbytes(it.second) + 512;
            }
        }
        if (size > 0) {
            printf("%s: %8s buffer size = %8.2f MB\n", __func__, ggml_backend_name(backend), size/1024.0/1024.0);
            // allocate the buffer
            ggml_backend_buffer_t buffer = ggml_backend_alloc_buffer(backend, size);
            ggml_backend_buffer_set_usage(buffer, GGML_BACKEND_BUFFER_USAGE_WEIGHTS);
            model.buffers_w.push_back(buffer);

            // create an allocator for the buffer to allocate the tensors
            auto alloc = ggml_tallocr_new(buffer);
            backend_buffers.insert(std::make_pair(backend, std::move(alloc)));
        } else {
            model.buffers_w.push_back(NULL);
        }
    }

    // allocate key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        ggml_set_name(model.memory_k, "model/memory_k");
        ggml_set_name(model.memory_v, "model/memory_v");

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        ggml_backend_t backend_kv = params.n_gpu_layers >= hparams.n_layer/2 ? backend_gpu : backend_cpu;
        printf("%s: backend_kv = %s\n", __func__, ggml_backend_name(backend_kv));
        model.buffer_kv = ggml_backend_alloc_buffer(backend_kv, memory_size + 512*2);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.buffer_kv);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.memory_k);
            ggml_tallocr_alloc(&alloc, model.memory_v);
        }
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            // allocate the tensor
            ggml_backend_t backend = tensor_backends[name];
            ggml_tallocr * alloc = &backend_buffers.find(backend)->second;
            ggml_tallocr_alloc(alloc, tensor);
            //printf("%s: [%5.5s] %s\n", __func__, ggml_backend_name(backend), name.c_str());

            if (ggml_backend_is_cpu(backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                ggml_tallocr * alloc_head = &backend_buffers.find(tensor_backends["model/lm_head"])->second;
                ggml_tallocr_alloc(alloc_head, model.lm_head);
                //printf("%s: [%5.5s] %s (copied)\n", __func__, ggml_backend_name(tensor_backends["model/lm_head"]), "model/lm_head");
                ggml_backend_tensor_copy(tensor, model.lm_head);
                total_size += ggml_nbytes(model.lm_head);
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }
        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    // allocate input tensors
    {
        model.embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);
        model.position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);

        ggml_set_name(model.embd, "in/embd");
        ggml_set_name(model.position, "in/position");

        // add input tensors to cpu backend
        size_t input_size = ggml_nbytes(model.embd) + ggml_nbytes(model.position);

        // FIXME: use cpu backend after sched impl
        ggml_backend_t backend_input = params.n_gpu_layers >= model.hparams.n_layer ? backend_gpu : backend_cpu;
        model.buffer_input = ggml_backend_alloc_buffer(backend_input, input_size + 512*3);
        printf("%s: backend_in = %s (%zu bytes)\n", __func__, ggml_backend_name(backend_input), input_size);

        // allocate the tensors into the backend buffer
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_input);
        ggml_tallocr_alloc(&alloc, model.embd);
        ggml_tallocr_alloc(&alloc, model.position);
    }

    return true;
}